

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

void __thiscall APlayerPawn::TweakSpeeds(APlayerPawn *this,double *forward,double *side)

{
  AInventory *pAVar1;
  double dVar2;
  double dVar3;
  
  if ((this->super_AActor).health <= this->RunHealth) {
    dVar2 = *forward;
    dVar3 = 6400.0;
    if (dVar2 <= 6400.0) {
      dVar3 = dVar2;
    }
    *forward = (double)(~-(ulong)(-6400.0 < dVar2) & 0xc0b9000000000000 |
                       (ulong)dVar3 & -(ulong)(-6400.0 < dVar2));
    dVar2 = *side;
    dVar3 = 6144.0;
    if (dVar2 <= 6144.0) {
      dVar3 = dVar2;
    }
    *side = (double)(~-(ulong)(-6144.0 < dVar2) & 0xc0b8000000000000 |
                    (ulong)dVar3 & -(ulong)(-6144.0 < dVar2));
  }
  *forward = *forward * (&this->ForwardMove1)[12800.0 <= ABS(*forward)];
  *side = *side * (&this->SideMove1)[10240.0 <= ABS(*side)];
  if ((((this->super_AActor).player)->morphTics == 0) &&
     (pAVar1 = (this->super_AActor).Inventory.field_0.p, pAVar1 != (AInventory *)0x0)) {
    if (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
      dVar2 = (double)(**(code **)((long)(pAVar1->super_AActor).super_DThinker.super_DObject.
                                         _vptr_DObject + 0x1e8))(pAVar1);
      *forward = *forward * dVar2;
      *side = dVar2 * *side;
    }
    else {
      (this->super_AActor).Inventory.field_0.p = (AInventory *)0x0;
    }
  }
  return;
}

Assistant:

void APlayerPawn::TweakSpeeds (double &forward, double &side)
{
	// Strife's player can't run when its health is below 10
	if (health <= RunHealth)
	{
		forward = clamp<double>(forward, -0x1900, 0x1900);
		side = clamp<double>(side, -0x1800, 0x1800);
	}

	// [GRB]
	if (fabs(forward) < 0x3200)
	{
		forward *= ForwardMove1;
	}
	else
	{
		forward *= ForwardMove2;
	}

	if (fabs(side) < 0x2800)
	{
		side *= SideMove1;
	}
	else
	{
		side *= SideMove2;
	}

	if (!player->morphTics && Inventory != NULL)
	{
		double factor = Inventory->GetSpeedFactor ();
		forward *= factor;
		side *= factor;
	}
}